

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  uint uVar1;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  iterator iVar6;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *name;
  uint *ts_1_00;
  undefined7 in_register_00000011;
  long lVar7;
  ID *__k;
  ulong uVar8;
  uint32_t alignment;
  string buffer_name;
  uint32_t type_id_local;
  string decorations;
  Bitset flags;
  string local_168;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  
  type_id_local = type_id;
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id);
  buffer_name._M_dataplus._M_p = (pointer)&buffer_name.field_2;
  buffer_name._M_string_length = 0;
  buffer_name.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,forward_declaration) == 0) {
    if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
      ts_1_00 = (uint *)0x0;
      (*(this->super_Compiler)._vptr_Compiler[6])
                (&attributes,this,(ulong)(pSVar3->super_IVariant).self.id);
    }
    else {
      ts_1_00 = (uint *)0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&attributes,this,pSVar3);
    }
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
    ::std::__cxx11::string::~string((string *)&attributes);
    iVar6 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->super_Compiler).physical_storage_type_to_alignment._M_h,&type_id_local);
    alignment = 0;
    if (iVar6.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
        ._M_cur == (__node_type *)0x0) {
      if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) goto LAB_0025566d;
LAB_00255834:
      statement<char_const(&)[33],std::__cxx11::string&>
                (this,(char (*) [33])"layout(buffer_reference) buffer ",&buffer_name);
    }
    else {
      alignment = *(uint32_t *)
                   ((long)iVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
                          ._M_cur + 0xc);
      if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
LAB_0025566d:
        attributes.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &attributes.stack_storage;
        attributes.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .buffer_size = 0;
        attributes.buffer_capacity = 8;
        ::std::__cxx11::string::string
                  ((string *)&flags,"buffer_reference",(allocator *)&decorations);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&attributes,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
        ::std::__cxx11::string::~string((string *)&flags);
        if (alignment != 0) {
          join<char_const(&)[26],unsigned_int&>
                    ((string *)&flags,(spirv_cross *)0x3968b5,(char (*) [26])&alignment,ts_1_00);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&attributes,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
          ::std::__cxx11::string::~string((string *)&flags);
        }
        buffer_to_packing_standard_abi_cxx11_((string *)&flags,this,pSVar3,true);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&attributes,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
        ::std::__cxx11::string::~string((string *)&flags);
        ParsedIR::get_buffer_block_type_flags(&flags,&(this->super_Compiler).ir,pSVar3);
        decorations._M_dataplus._M_p = (pointer)&decorations.field_2;
        decorations._M_string_length = 0;
        decorations.field_2._M_local_buf[0] = '\0';
        if (((uint)flags.lower >> 0x13 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
        }
        if (((uint)flags.lower >> 0x17 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
        }
        if (((uint)flags.lower >> 0x19 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
        }
        if (((uint)flags.lower >> 0x18 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
        }
        merge(&local_168,&attributes,", ");
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                  (this,(char (*) [8])"layout(",&local_168,(char (*) [2])0x39e39a,&decorations,
                   (char (*) [9])0x3968e7,&buffer_name);
        ::std::__cxx11::string::~string((string *)&local_168);
        ::std::__cxx11::string::~string((string *)&decorations);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&flags.higher._M_h);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector(&attributes);
      }
      else {
        if (alignment == 0) goto LAB_00255834;
        statement<char_const(&)[51],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                  (this,(char (*) [51])"layout(buffer_reference, buffer_reference_align = ",
                   &alignment,(char (*) [10])0x3968e6,&buffer_name);
      }
    }
    begin_scope(this);
    if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(pSVar3->member_name_cache)._M_h);
      pTVar2 = (pSVar3->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
               .ptr;
      uVar8 = 0;
      for (lVar7 = (pSVar3->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size << 2;
          lVar7 != 0; lVar7 = lVar7 + -4) {
        add_member_name(this,pSVar3,(uint32_t)uVar8);
        uVar1 = pTVar2[uVar8].id;
        ::std::__cxx11::string::string((string *)&attributes,"",(allocator *)&flags);
        (*(this->super_Compiler)._vptr_Compiler[0x15])
                  (this,pSVar3,(ulong)uVar1,uVar8 & 0xffffffff,&attributes,0);
        ::std::__cxx11::string::~string((string *)&attributes);
        uVar8 = uVar8 + 1;
      }
    }
    else {
      pSVar3 = Compiler::get_pointee_type(&this->super_Compiler,pSVar3);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&attributes,this,pSVar3,0);
      (*(this->super_Compiler)._vptr_Compiler[0x26])(&flags,this,pSVar3);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &attributes,(char (*) [7])" value",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                 (char (*) [2])0x39d4f0);
      ::std::__cxx11::string::~string((string *)&flags);
      ::std::__cxx11::string::~string((string *)&attributes);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3930a4);
    goto LAB_00255988;
  }
  ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&attributes,this,(ulong)(pSVar3->super_IVariant).self.id);
  __k = &(pSVar3->super_IVariant).self;
  ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
  ::std::__cxx11::string::~string((string *)&attributes);
  this_00 = &(this->super_Compiler).ir.meta;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  if ((pmVar4->decoration).alias._M_string_length == 0) {
LAB_002554d2:
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
              ((string *)&attributes,(spirv_cross *)0x3a29dc,(char (*) [2])__k,ts_1);
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
    ::std::__cxx11::string::~string((string *)&attributes);
  }
  else {
    iVar5 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->block_ssbo_names)._M_h,&buffer_name);
    if (iVar5.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) goto LAB_002554d2;
    iVar5 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->resource_names)._M_h,&buffer_name);
    if (iVar5.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) goto LAB_002554d2;
  }
  name = &buffer_name;
  add_variable(this,&this->block_ssbo_names,&this->resource_names,name);
  if (buffer_name._M_string_length == 0) {
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
              ((string *)&attributes,(spirv_cross *)0x3a29dc,(char (*) [2])__k,
               (TypedID<(spirv_cross::Types)0> *)name);
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
    ::std::__cxx11::string::~string((string *)&attributes);
  }
  ::std::__detail::
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->block_names,&buffer_name);
  ::std::__detail::
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->block_ssbo_names,&buffer_name);
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  ::std::__cxx11::string::_M_assign((string *)pmVar4);
  statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
            (this,(char (*) [33])"layout(buffer_reference) buffer ",&buffer_name,
             (char (*) [2])0x39d4f0);
LAB_00255988:
  ::std::__cxx11::string::~string((string *)&buffer_name);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration)
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else if (type.basetype != SPIRType::Struct)
		buffer_name = type_to_glsl(type);
	else
		buffer_name = to_name(type.self, false);

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (type.basetype == SPIRType::Struct)
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else if (alignment)
			statement("layout(buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
		else
			statement("layout(buffer_reference) buffer ", buffer_name);

		begin_scope();

		if (type.basetype == SPIRType::Struct)
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}